

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

type __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Color>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  bool bVar1;
  size_t sVar2;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__it;
  long lVar3;
  conv_error *pcVar4;
  error_category *peVar5;
  long lVar6;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar8;
  long lVar9;
  long lVar10;
  pair<const_std::pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_std::pair<(anonymous_namespace)::ns::Color,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  pVar11;
  error_code ec;
  error_code ec_00;
  allocator<char> local_61;
  string_view_type s;
  string local_50;
  
  bVar1 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::Color,_void>
          ::is(this);
  if (!bVar1) {
    pcVar4 = (conv_error *)__cxa_allocate_exception(0x58);
    peVar5 = conv_error_category();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Not a ns::Color",(allocator<char> *)&s);
    ec._M_cat = peVar5;
    ec._0_8_ = 1;
    conv_error::conv_error(pcVar4,ec,&local_50);
    __cxa_throw(pcVar4,&conv_error::typeinfo,conv_error::~conv_error);
  }
  s = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_void>
      ::as(this);
  sVar2 = s._M_len;
  pVar11 = json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>
           ::get_values_abi_cxx11_();
  __it = pVar11.first;
  pVar11 = json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>
           ::get_values_abi_cxx11_();
  ppVar7 = pVar11.second;
  lVar10 = (long)ppVar7 - (long)__it;
  lVar9 = lVar10 / 0x28 >> 2;
  lVar3 = lVar10;
  lVar6 = lVar9;
  ppVar8 = __it;
  if (sVar2 == 0) {
    for (; 0 < lVar6; lVar6 = lVar6 + -1) {
      if (ppVar8->first == yellow) goto LAB_005d6347;
      if (ppVar8[1].first == yellow) {
        ppVar8 = ppVar8 + 1;
        goto LAB_005d6347;
      }
      if (ppVar8[2].first == yellow) {
        ppVar8 = ppVar8 + 2;
        goto LAB_005d6347;
      }
      if (ppVar8[3].first == yellow) {
        ppVar8 = ppVar8 + 3;
        goto LAB_005d6347;
      }
      lVar3 = lVar3 + -0xa0;
      ppVar8 = ppVar8 + 4;
    }
    lVar3 = lVar3 / 0x28;
    if (lVar3 == 1) {
LAB_005d632c:
      if (ppVar8->first != yellow) {
        return yellow;
      }
    }
    else if (lVar3 == 2) {
LAB_005d6323:
      if (ppVar8->first != yellow) {
        ppVar8 = ppVar8 + 1;
        goto LAB_005d632c;
      }
    }
    else {
      if (lVar3 != 3) {
        return yellow;
      }
      if (ppVar8->first != yellow) {
        ppVar8 = ppVar8 + 1;
        goto LAB_005d6323;
      }
    }
LAB_005d6347:
    if (ppVar8 == ppVar7) {
      return yellow;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&s;
  for (; ppVar8 = __it, 0 < lVar9; lVar9 = lVar9 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,__it);
    if (bVar1) goto LAB_005d6408;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,__it + 1);
    ppVar8 = __it + 1;
    if (bVar1) goto LAB_005d6408;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,__it + 2);
    ppVar8 = __it + 2;
    if (bVar1) goto LAB_005d6408;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,__it + 3);
    ppVar8 = __it + 3;
    if (bVar1) goto LAB_005d6408;
    __it = __it + 4;
    lVar10 = lVar10 + -0xa0;
  }
  lVar10 = lVar10 / 0x28;
  if (lVar10 == 1) {
LAB_005d6416:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,__it);
    ppVar8 = __it;
    if (!bVar1) goto LAB_005d642a;
  }
  else if (lVar10 == 2) {
LAB_005d63f4:
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,ppVar8);
    if (!bVar1) {
      __it = ppVar8 + 1;
      goto LAB_005d6416;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_005d642a;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::{lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)#2}>
            ::operator()((_Iter_pred<jsoncons::json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Color,void>::as(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)::_lambda(std::pair<(anonymous_namespace)::ns::Color,std::__cxx11::string>const&)_2_>
                          *)&local_50,__it);
    if (!bVar1) {
      ppVar8 = __it + 1;
      goto LAB_005d63f4;
    }
  }
LAB_005d6408:
  if (ppVar8 != ppVar7) {
    return ppVar8->first;
  }
LAB_005d642a:
  if (s._M_len == 0) {
    return yellow;
  }
  pcVar4 = (conv_error *)__cxa_allocate_exception(0x58);
  peVar5 = conv_error_category();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Not an enum",&local_61);
  ec_00._M_cat = peVar5;
  ec_00._0_8_ = 1;
  conv_error::conv_error(pcVar4,ec_00,&local_50);
  __cxa_throw(pcVar4,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }